

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O3

void __thiscall
glcts::ArraysOfArrays::ExpressionsIndexingArray1<glcts::ArraysOfArrays::Interface::GL>::
test_shader_compilation
          (ExpressionsIndexingArray1<glcts::ArraysOfArrays::Interface::GL> *this,
          TestShaderType tested_shader_type)

{
  ulong *puVar1;
  TestError *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  string variable_declaration;
  string shader_source;
  string variable_initializations [8];
  
  shader_source._M_dataplus._M_p = (pointer)&shader_source.field_2;
  shader_source._M_string_length = 0;
  shader_source.field_2._M_local_buf[0] = '\0';
  variable_declaration._M_dataplus._M_p = (pointer)&variable_declaration.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&variable_declaration,"float x[1][1][1][1][1][1][1][1];\n\n","");
  variable_initializations[0]._M_dataplus._M_p = (pointer)&variable_initializations[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)variable_initializations,
             "x[0]                      = float[1][1][1][1][1][1][1](float[1][1][1][1][1][1](float[1][1][1][1][1](float[1][1][1][1](float[1][1][1](float[1][1](float[1](1.0)))))));\n"
             ,"");
  variable_initializations[1]._M_dataplus._M_p = (pointer)&variable_initializations[1].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(variable_initializations + 1),
             "x[0][0]                   = float[1][1][1][1][1][1](float[1][1][1][1][1](float[1][1][1][1](float[1][1][1](float[1][1](float[1](1.0))))));\n"
             ,"");
  variable_initializations[2]._M_dataplus._M_p = (pointer)&variable_initializations[2].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(variable_initializations + 2),
             "x[0][0][0]                = float[1][1][1][1][1](float[1][1][1][1](float[1][1][1](float[1][1](float[1](1.0)))));\n"
             ,"");
  variable_initializations[3]._M_dataplus._M_p = (pointer)&variable_initializations[3].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(variable_initializations + 3),
             "x[0][0][0][0]             = float[1][1][1][1](float[1][1][1](float[1][1](float[1](1.0))));\n"
             ,"");
  variable_initializations[4]._M_dataplus._M_p = (pointer)&variable_initializations[4].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(variable_initializations + 4),
             "x[0][0][0][0][0]          = float[1][1][1](float[1][1](float[1](1.0)));\n","");
  variable_initializations[5]._M_dataplus._M_p = (pointer)&variable_initializations[5].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(variable_initializations + 5),
             "x[0][0][0][0][0][0]       = float[1][1](float[1](1.0));\n","");
  variable_initializations[6]._M_dataplus._M_p = (pointer)&variable_initializations[6].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(variable_initializations + 6),"x[0][0][0][0][0][0][0]    = float[1](1.0);\n"
             ,"");
  variable_initializations[7]._M_dataplus._M_p = (pointer)&variable_initializations[7].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(variable_initializations + 7),"x[0][0][0][0][0][0][0][0] = 1.0;\n","");
  std::operator+(&local_1a0,&variable_declaration,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &shader_start_abi_cxx11_);
  std::__cxx11::string::operator=((string *)&shader_source,(string *)&local_1a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
    operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
  }
  std::operator+(&local_1a0,"    ",variable_initializations);
  std::__cxx11::string::_M_append((char *)&shader_source,(ulong)local_1a0._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
    operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
  }
  puVar1 = &set_tesseation_abi_cxx11_;
  switch((ulong)tested_shader_type) {
  case 0:
  case 2:
  case 5:
    break;
  case 1:
    std::__cxx11::string::append((char *)&shader_source);
    break;
  case 3:
    puVar1 = &emit_quad_abi_cxx11_;
  case 4:
    std::__cxx11::string::_M_append((char *)&shader_source,*puVar1);
    break;
  default:
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Unrecognized shader type.",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
               ,0xc7f);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  std::__cxx11::string::_M_append((char *)&shader_source,shader_end_abi_cxx11_);
  (*(code *)(&DAT_01ad3e8c + *(int *)(&DAT_01ad3e8c + (ulong)tested_shader_type * 4)))
            (&DAT_01ad3e8c + *(int *)(&DAT_01ad3e8c + (ulong)tested_shader_type * 4),
             empty_string_abi_cxx11_,empty_string_abi_cxx11_,empty_string_abi_cxx11_,
             empty_string_abi_cxx11_,empty_string_abi_cxx11_);
  return;
}

Assistant:

void ExpressionsIndexingArray1<API>::test_shader_compilation(
	typename TestCaseBase<API>::TestShaderType tested_shader_type)
{
	std::string shader_source;
	std::string variable_declaration = "float x[1][1][1][1][1][1][1][1];\n\n";

	std::string variable_initializations[] = {
		"x[0]                      = float[1][1][1][1][1][1][1]("
		"float[1][1][1][1][1][1](float[1][1][1][1][1](float[1][1][1][1](float[1][1][1](float[1][1](float[1](1.0)))))));"
		"\n",
		"x[0][0]                   = "
		"float[1][1][1][1][1][1](float[1][1][1][1][1](float[1][1][1][1](float[1][1][1](float[1][1](float[1](1.0))))));"
		"\n",
		"x[0][0][0]                = "
		"float[1][1][1][1][1](float[1][1][1][1](float[1][1][1](float[1][1](float[1](1.0)))));\n",
		"x[0][0][0][0]             = float[1][1][1][1](float[1][1][1](float[1][1](float[1](1.0))));\n",
		"x[0][0][0][0][0]          = float[1][1][1](float[1][1](float[1](1.0)));\n",
		"x[0][0][0][0][0][0]       = float[1][1](float[1](1.0));\n", "x[0][0][0][0][0][0][0]    = float[1](1.0);\n",
		"x[0][0][0][0][0][0][0][0] = 1.0;\n"
	};

	for (size_t string_index = 0; string_index < sizeof(variable_initializations) / sizeof(variable_initializations[0]);
		 string_index++)
	{
		shader_source = variable_declaration + shader_start;
		shader_source += "    " + variable_initializations[string_index];

		/* End main */
		DEFAULT_MAIN_ENDING(tested_shader_type, shader_source);

		/* Execute test */
		EXECUTE_POSITIVE_TEST(tested_shader_type, shader_source, true, false);
	} /* for (int string_index = 0; ...) */
}